

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double inspherefast(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dab;
  double cda;
  double bcd;
  double abc;
  double bd;
  double ac;
  double da;
  double cd;
  double bc;
  double ab;
  double dlift;
  double clift;
  double blift;
  double alift;
  double dez;
  double cez;
  double bez;
  double aez;
  double dey;
  double cey;
  double bey;
  double aey;
  double dex;
  double cex;
  double bex;
  double aex;
  double *pe_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar1 = *pa - *pe;
  dVar2 = *pb - *pe;
  dVar3 = *pc - *pe;
  dVar4 = *pd - *pe;
  dVar5 = pa[1] - pe[1];
  dVar6 = pb[1] - pe[1];
  dVar7 = pc[1] - pe[1];
  dVar8 = pd[1] - pe[1];
  dVar9 = pa[2] - pe[2];
  dVar10 = pb[2] - pe[2];
  dVar11 = pc[2] - pe[2];
  dVar12 = pd[2] - pe[2];
  dVar13 = dVar1 * dVar6 + -(dVar2 * dVar5);
  dVar14 = dVar2 * dVar7 + -(dVar3 * dVar6);
  dVar15 = dVar3 * dVar8 + -(dVar4 * dVar7);
  dVar16 = dVar4 * dVar5 + -(dVar1 * dVar8);
  dVar17 = dVar1 * dVar7 + -(dVar3 * dVar5);
  dVar18 = dVar2 * dVar8 + -(dVar4 * dVar6);
  return (dVar12 * dVar12 + dVar4 * dVar4 + dVar8 * dVar8) *
         (dVar11 * dVar13 + dVar9 * dVar14 + -(dVar10 * dVar17)) +
         -((dVar11 * dVar11 + dVar3 * dVar3 + dVar7 * dVar7) *
          (dVar10 * dVar16 + dVar12 * dVar13 + dVar9 * dVar18)) +
         (dVar10 * dVar10 + dVar2 * dVar2 + dVar6 * dVar6) *
         (dVar9 * dVar15 + dVar11 * dVar16 + dVar12 * dVar17) +
         -((dVar9 * dVar9 + dVar1 * dVar1 + dVar5 * dVar5) *
          (dVar12 * dVar14 + dVar10 * dVar15 + -(dVar11 * dVar18)));
}

Assistant:

REAL inspherefast(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  REAL aex, bex, cex, dex;
  REAL aey, bey, cey, dey;
  REAL aez, bez, cez, dez;
  REAL alift, blift, clift, dlift;
  REAL ab, bc, cd, da, ac, bd;
  REAL abc, bcd, cda, dab;

  aex = pa[0] - pe[0];
  bex = pb[0] - pe[0];
  cex = pc[0] - pe[0];
  dex = pd[0] - pe[0];
  aey = pa[1] - pe[1];
  bey = pb[1] - pe[1];
  cey = pc[1] - pe[1];
  dey = pd[1] - pe[1];
  aez = pa[2] - pe[2];
  bez = pb[2] - pe[2];
  cez = pc[2] - pe[2];
  dez = pd[2] - pe[2];

  ab = aex * bey - bex * aey;
  bc = bex * cey - cex * bey;
  cd = cex * dey - dex * cey;
  da = dex * aey - aex * dey;

  ac = aex * cey - cex * aey;
  bd = bex * dey - dex * bey;

  abc = aez * bc - bez * ac + cez * ab;
  bcd = bez * cd - cez * bd + dez * bc;
  cda = cez * da + dez * ac + aez * cd;
  dab = dez * ab + aez * bd + bez * da;

  alift = aex * aex + aey * aey + aez * aez;
  blift = bex * bex + bey * bey + bez * bez;
  clift = cex * cex + cey * cey + cez * cez;
  dlift = dex * dex + dey * dey + dez * dez;

  return (dlift * abc - clift * dab) + (blift * cda - alift * bcd);
}